

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O1

parser<pstore::exchange::import_ns::callbacks> * __thiscall
(anonymous_namespace)::
parse<(pstore::repo::section_kind)2,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,
          _anonymous_namespace_ *this,string *src,database *db,string_mapping *names,
          back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
          *inserter,not_null<pstore::repo::section_content_*> content)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  pointer *__ptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  parser<pstore::exchange::import_ns::callbacks> parser;
  callbacks local_100;
  callbacks local_f0;
  not_null<pstore::database_*> local_e0;
  parser<pstore::exchange::import_ns::callbacks> local_d8;
  
  local_e0.ptr_ = (database *)src;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant(&local_e0);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::bss_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping_const*,pstore::gsl::not_null<pstore::repo::section_content*>,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping_const*,pstore::gsl::not_null<pstore::repo::section_content*>,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
            (&local_f0,local_e0,bss,(string_mapping *)db,
             (not_null<pstore::repo::section_content_*>)inserter,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)names);
  local_100.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_f0.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_100.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_f0.context_.
          super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_f0.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f0.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_f0.context_.
            super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f0.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_f0.context_.
            super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser(&local_d8,&local_100,none);
  if (local_100.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_f0.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      (&local_d8,(string *)this);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  (__return_storage_ptr__->singletons_)._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl =
       (singleton_storage<pstore::exchange::import_ns::callbacks> *)
       local_d8.singletons_._M_t.
       super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       .
       super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
       ._M_head_impl;
  local_d8.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>,_true,_true>
        )(__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
          )0x0;
  std::
  _Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::_Deque_base((_Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                 *)&__return_storage_ptr__->stack_,
                (_Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                 *)&local_d8.stack_);
  (__return_storage_ptr__->error_)._M_value = local_d8.error_._M_value;
  *(undefined4 *)&(__return_storage_ptr__->error_).field_0x4 = local_d8.error_._4_4_;
  (__return_storage_ptr__->error_)._M_cat = local_d8.error_._M_cat;
  (__return_storage_ptr__->callbacks_).context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_d8.callbacks_.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->callbacks_).context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->callbacks_).context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_d8.callbacks_.context_.
          super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  __return_storage_ptr__->extensions_ = local_d8.extensions_;
  paVar1 = &(__return_storage_ptr__->string_).field_2;
  (__return_storage_ptr__->string_)._M_dataplus._M_p = (pointer)paVar1;
  paVar2 = &local_d8.string_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.string_._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_d8.string_.field_2._M_allocated_capacity._1_7_,
                  local_d8.string_.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->string_).field_2 + 8) =
         local_d8.string_.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->string_)._M_dataplus._M_p = local_d8.string_._M_dataplus._M_p;
    (__return_storage_ptr__->string_).field_2._M_allocated_capacity =
         CONCAT71(local_d8.string_.field_2._M_allocated_capacity._1_7_,
                  local_d8.string_.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->string_)._M_string_length = local_d8.string_._M_string_length;
  __return_storage_ptr__->coordinate_ = local_d8.coordinate_;
  local_d8.string_.field_2._M_local_buf[0] = '\0';
  local_d8.string_._M_string_length = 0;
  local_d8.callbacks_.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.callbacks_.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d8.string_._M_dataplus._M_p = (pointer)paVar2;
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_d8.stack_.c);
  if ((_Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       )local_d8.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
        ._M_head_impl != (singleton_storage<pstore::exchange::import_ns::callbacks> *)0x0) {
    operator_delete((void *)local_d8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  return __return_storage_ptr__;
}

Assistant:

decltype (auto) parse (std::string const & src, pstore::database * const db,
                           pstore::exchange::import_ns::string_mapping const & names,
                           OutputIterator * const inserter,                        // out
                           not_null<pstore::repo::section_content *> const content // out
    ) {

        // The type used to store the properties of a section of section-kind Kind.
        using section_type = typename pstore::repo::enum_to_section_t<Kind>;
        // Find the rule that is used to import sections represented by an instance of
        // section_type.
        using section_importer =
            pstore::exchange::import_ns::section_to_importer_t<section_type, OutputIterator>;
        // Create a JSON parser which understands this section object.
        auto parser =
            make_json_object_parser<section_importer> (db, Kind, &names, content, inserter);
        // Parse the string.
        parser.input (src).eof ();
        return parser;
    }